

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolOcclusionTests.cpp
# Opt level: O0

void __thiscall
vkt::QueryPool::anon_unknown_0::OcclusionQueryTestInstance::logResults
          (OcclusionQueryTestInstance *this,deUint64 *results,deUint64 *availability)

{
  TestContext *this_00;
  MessageBuilder *pMVar1;
  MessageBuilder local_340;
  MessageBuilder local_1b0;
  int local_2c;
  TestLog *pTStack_28;
  int ndx;
  TestLog *log;
  deUint64 *availability_local;
  deUint64 *results_local;
  OcclusionQueryTestInstance *this_local;
  
  log = (TestLog *)availability;
  availability_local = results;
  results_local = (deUint64 *)this;
  this_00 = Context::getTestContext((this->super_TestInstance).m_context);
  pTStack_28 = tcu::TestContext::getLog(this_00);
  for (local_2c = 0; local_2c < 3; local_2c = local_2c + 1) {
    if (((this->m_testVector).queryResultsAvailability & 1U) == 0) {
      tcu::TestLog::operator<<(&local_1b0,pTStack_28,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar1 = tcu::MessageBuilder::operator<<(&local_1b0,(char (*) [16])"query[ slot == ");
      pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_2c);
      pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [13])"] result == ");
      pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,availability_local + local_2c);
      tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1b0);
    }
    else {
      tcu::TestLog::operator<<(&local_340,pTStack_28,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar1 = tcu::MessageBuilder::operator<<(&local_340,(char (*) [16])"query[ slot == ");
      pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_2c);
      pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [13])"] result == ");
      pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,availability_local + local_2c);
      pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [19])", availability\t== ");
      pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(unsigned_long *)(log + local_2c));
      tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_340);
    }
  }
  return;
}

Assistant:

void OcclusionQueryTestInstance::logResults (const deUint64* results, const deUint64* availability)
{
	tcu::TestLog& log = m_context.getTestContext().getLog();

	for (int ndx = 0; ndx < NUM_QUERIES_IN_POOL; ++ndx)
	{
		if (!m_testVector.queryResultsAvailability)
		{
			log << tcu::TestLog::Message << "query[ slot == " << ndx << "] result == " << results[ndx] << tcu::TestLog::EndMessage;
		}
		else
		{
			log << tcu::TestLog::Message << "query[ slot == " << ndx << "] result == " << results[ndx] << ", availability	== " << availability[ndx] << tcu::TestLog::EndMessage;
		}
	}
}